

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClrDirWrapper.cpp
# Opt level: O2

QString * __thiscall
ClrDirWrapper::translateFieldContent
          (QString *__return_storage_ptr__,ClrDirWrapper *this,size_t fieldId)

{
  IMAGE_COR20_HEADER *pIVar1;
  _Base_ptr p_Var2;
  DWORD flags;
  QString flagInfo;
  QStringList list;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> flagsSet;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<QString> local_78;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_58;
  
  pIVar1 = clrDir(this);
  if ((pIVar1 == (IMAGE_COR20_HEADER *)0x0) || (fieldId != 5)) {
    QString::QString(__return_storage_ptr__,"");
  }
  else {
    getFlagsSet((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                &local_58,(ClrDirWrapper *)(ulong)pIVar1->Flags,flags);
    local_78.size = 0;
    local_78.d = (Data *)0x0;
    local_78.ptr = (QString *)0x0;
    for (p_Var2 = local_58._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &local_58._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      translateFlag((QString *)&local_90,p_Var2[1]._M_color);
      if (local_90.size != 0) {
        QList<QString>::emplaceBack<QString_const&>
                  ((QList<QString> *)&local_78,(QString *)&local_90);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    }
    QString::QString((QString *)&local_90,";");
    QListSpecialMethods<QString>::join
              (__return_storage_ptr__,(QListSpecialMethods<QString> *)&local_78,(QString *)&local_90
              );
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

QString ClrDirWrapper::translateFieldContent(size_t fieldId)
{
    const pe::IMAGE_COR20_HEADER* d = clrDir();
    if (!d) return "";
    
    if (fieldId != FLAGS) return "";
    
    std::set<DWORD> flagsSet = ClrDirWrapper::getFlagsSet(d->Flags);
    std::set<DWORD>::iterator itr;
    QStringList list;
    for (itr = flagsSet.begin() ; itr != flagsSet.end(); ++itr) {
        const DWORD nextFlag = *itr;
        const QString flagInfo = ClrDirWrapper::translateFlag(nextFlag);
        if (flagInfo.length() == 0) continue;
        list.append(flagInfo);
    }
    return list.join(";");
}